

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
adios2sys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,vector<char_*,_std::allocator<char_*>_> *variable,
          string *value)

{
  long lVar1;
  char *__dest;
  char *__src;
  value_type *in_RDX;
  vector<char_*,_std::allocator<char_*>_> *in_RSI;
  char *var;
  
  lVar1 = std::__cxx11::string::size();
  __dest = (char *)operator_new__(lVar1 + 1);
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(__dest,__src);
  std::vector<char_*,_std::allocator<char_*>_>::push_back(in_RSI,in_RDX);
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(std::vector<char*>* variable,
                                            const std::string& value)
{
  char* var = new char[value.size() + 1];
  strcpy(var, value.c_str());
  variable->push_back(var);
}